

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

bool __thiscall
google::protobuf::internal::ParseNoReflection(internal *this,string_view from,MessageLite *to)

{
  bool bVar1;
  int depth;
  undefined1 local_b8 [8];
  ParseContext ctx;
  char *ptr;
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_descriptor_cc:659:7)>
  local_2a;
  MessageLite *pMStack_28;
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_descriptor_cc:659:7)>
  cleanup;
  MessageLite *to_local;
  string_view from_local;
  
  pMStack_28 = (MessageLite *)from._M_str;
  from_local._M_len = from._M_len;
  to_local = (MessageLite *)this;
  anon_unknown_24::DisableTracking();
  (*pMStack_28->_vptr_MessageLite[2])();
  depth = io::CodedInputStream::GetDefaultRecursionLimit();
  ParseContext::ParseContext<std::basic_string_view<char,std::char_traits<char>>&>
            ((ParseContext *)local_b8,depth,false,(char **)&ctx.data_.factory,
             (basic_string_view<char,_std::char_traits<char>_> *)&to_local);
  ctx.data_.factory =
       (MessageFactory *)
       MessageLite::_InternalParse(pMStack_28,(char *)ctx.data_.factory,(ParseContext *)local_b8);
  if ((ctx.data_.factory == (MessageFactory *)0x0) ||
     (bVar1 = EpsCopyInputStream::EndedAtLimit((EpsCopyInputStream *)local_b8), !bVar1)) {
    from_local._M_str._7_1_ = false;
  }
  else {
    from_local._M_str._7_1_ = MessageLite::IsInitializedWithErrors(pMStack_28);
  }
  absl::lts_20250127::
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc:659:7)>
  ::~Cleanup(&local_2a);
  return (bool)(from_local._M_str._7_1_ & 1);
}

Assistant:

bool ParseNoReflection(absl::string_view from, google::protobuf::MessageLite& to) {
  auto cleanup = DisableTracking();

  to.Clear();
  const char* ptr;
  internal::ParseContext ctx(io::CodedInputStream::GetDefaultRecursionLimit(),
                             false, &ptr, from);
  ptr = to._InternalParse(ptr, &ctx);
  if (ptr == nullptr || !ctx.EndedAtLimit()) return false;
  return to.IsInitializedWithErrors();
}